

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::f_formatter<spdlog::details::scoped_padder>::format
          (f_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  uint32_or_64_or_128_t<unsigned_long> n;
  ulong value;
  long lVar5;
  format_decimal_result<char_*> fVar6;
  scoped_padder p;
  scoped_padder sStack_68;
  char local_40 [21];
  char acStack_2b [3];
  char *local_28;
  
  lVar5 = (msg->time).__d.__r;
  value = (lVar5 / 1000000000) * -1000000 + lVar5 / 1000;
  scoped_padder::scoped_padder(&sStack_68,6,&(this->super_flag_formatter).padinfo_,dest);
  lVar5 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  uVar1 = (uint)(byte)fmt::v10::detail::do_count_digits(unsigned_long)::bsr2log10[lVar5] -
          (uint)(value < *(ulong *)(fmt::v10::detail::do_count_digits(unsigned_long)::
                                    zero_or_powers_of_10 +
                                   (ulong)(byte)fmt::v10::detail::do_count_digits(unsigned_long)::
                                                bsr2log10[lVar5] * 8));
  if (uVar1 < 6) {
    iVar3 = 6 - uVar1;
    do {
      sVar2 = (dest->super_buffer<char>).size_;
      uVar4 = sVar2 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar4) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar2 = (dest->super_buffer<char>).size_;
        uVar4 = sVar2 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar4;
      (dest->super_buffer<char>).ptr_[sVar2] = '0';
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  fVar6 = fmt::v10::detail::format_decimal<char,unsigned_long>(local_40,value,0x15);
  local_28 = fVar6.begin;
  lVar5 = (long)local_40 - (long)local_28;
  if (-0x16 < lVar5) {
    fmt::v10::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_28,local_28 + lVar5 + 0x15);
    scoped_padder::~scoped_padder(&sStack_68);
    return;
  }
  fmt::v10::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/core.h"
             ,0x189,"negative value");
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        auto micros = fmt_helper::time_fraction<std::chrono::microseconds>(msg.time);

        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad6(static_cast<size_t>(micros.count()), dest);
    }